

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kickpass.c
# Opt level: O3

kp_error_t kp_password_prompt(kp_ctx *ctx,_Bool confirm,char *password,char *fmt,...)

{
  char in_AL;
  kp_error_t kVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_d8;
  undefined1 local_b8 [32];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  if (ctx->password_prompt ==
      (_func_kp_error_t_kp_ctx_ptr__Bool_char_ptr_char_ptr___va_list_tag_ptr *)0x0) {
    kVar1 = 0xb;
  }
  else {
    local_d8.reg_save_area = local_b8;
    local_d8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_d8.gp_offset = 0x20;
    local_d8.fp_offset = 0x30;
    local_98 = in_R8;
    local_90 = in_R9;
    kVar1 = (*ctx->password_prompt)(ctx,confirm,password,fmt,&local_d8);
  }
  return kVar1;
}

Assistant:

kp_error_t
kp_password_prompt(struct kp_ctx *ctx, bool confirm, char *password, const char *fmt, ...)
{
	kp_error_t ret;
	va_list ap;

	assert(ctx);

	if (ctx->password_prompt == NULL) {
		return KP_NOPROMPT;
	}

	va_start(ap, fmt);
	ret = ctx->password_prompt(ctx, confirm, password, fmt, ap);
	va_end(ap);

	return ret;
}